

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

void __thiscall
cbtAlignedObjectArray<cbtOptimizedBvhNode>::resize
          (cbtAlignedObjectArray<cbtOptimizedBvhNode> *this,int newsize,
          cbtOptimizedBvhNode *fillData)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  
  iVar2 = this->m_size;
  lVar11 = (long)iVar2;
  if (iVar2 <= newsize) {
    if (iVar2 < newsize) {
      reserve(this,newsize);
    }
    lVar10 = lVar11 << 6;
    for (; lVar11 < newsize; lVar11 = lVar11 + 1) {
      uVar3 = *(undefined8 *)((fillData->m_aabbMinOrg).m_floats + 2);
      uVar4 = *(undefined8 *)(fillData->m_aabbMaxOrg).m_floats;
      uVar5 = *(undefined8 *)((fillData->m_aabbMaxOrg).m_floats + 2);
      uVar6 = *(undefined8 *)&fillData->m_escapeIndex;
      uVar7 = *(undefined8 *)&fillData->m_triangleIndex;
      uVar8 = *(undefined8 *)(fillData->m_padding + 4);
      uVar9 = *(undefined8 *)(fillData->m_padding + 0xc);
      puVar1 = (undefined8 *)((long)(this->m_data->m_aabbMinOrg).m_floats + lVar10);
      *puVar1 = *(undefined8 *)(fillData->m_aabbMinOrg).m_floats;
      puVar1[1] = uVar3;
      puVar1[2] = uVar4;
      puVar1[3] = uVar5;
      puVar1[4] = uVar6;
      puVar1[5] = uVar7;
      puVar1[6] = uVar8;
      puVar1[7] = uVar9;
      lVar10 = lVar10 + 0x40;
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE void resize(int newsize, const T& fillData = T())
	{
		const int curSize = size();

		if (newsize < curSize)
		{
			for (int i = newsize; i < curSize; i++)
			{
				m_data[i].~T();
			}
		}
		else
		{
			if (newsize > curSize)
			{
				reserve(newsize);
			}
#ifdef BT_USE_PLACEMENT_NEW
			for (int i = curSize; i < newsize; i++)
			{
				new (&m_data[i]) T(fillData);
			}
#endif  //BT_USE_PLACEMENT_NEW
		}

		m_size = newsize;
	}